

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O3

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::matchNext
          (InstMatcher *this,uint specVar,TermList nodeTerm,bool separate)

{
  bool bVar1;
  TermList *pTVar2;
  undefined7 in_register_00000009;
  TermList queryTerm;
  
  if ((int)CONCAT71(in_register_00000009,separate) != 0) {
    pTVar2 = (this->_boundVars)._cursor;
    if (pTVar2 == (this->_boundVars)._end) {
      Lib::Stack<Kernel::TermList>::expand(&this->_boundVars);
      pTVar2 = (this->_boundVars)._cursor;
    }
    pTVar2->_content = 2;
    (this->_boundVars)._cursor = pTVar2 + 1;
  }
  queryTerm._content._4_4_ = 0;
  queryTerm._content._0_4_ = specVar * 4 + 3;
  bVar1 = matchNextAux(this,queryTerm,nodeTerm,separate);
  return bVar1;
}

Assistant:

bool SubstitutionTree<LeafData_>::InstMatcher::matchNext(unsigned specVar, TermList nodeTerm, bool separate)
{
  if(separate) {
    _boundVars.push(TermList::empty());
  }

#if VDEBUG
  {
    //we assert that all the special variables in the nodeTerm are unbound
    VariableIterator vit(nodeTerm);
    while(vit.hasNext()) {
      TermList var=vit.next();
      if(var.isSpecialVar()) {
  ASS(!isBound(var));
      }
    }
  }
#endif
  return matchNextAux(TermList(specVar, true), nodeTerm, separate);
}